

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>
anon_unknown.dwarf_17105::createSamplePublisher(Value *v)

{
  Value *pVVar1;
  invalid_argument *this;
  __uniq_ptr_data<SamplePublisher,_std::default_delete<SamplePublisher>,_true,_true> in_RDI;
  Value *sendBuffer;
  Value *bind;
  unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *p;
  int in_stack_0000010c;
  Publisher *in_stack_00000110;
  string *in_stack_000001a0;
  Value *in_stack_000001a8;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  allocator local_79;
  string local_78 [32];
  Value *local_58;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  Value *local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"bind",&local_39);
  pVVar1 = toml::Value::find(in_stack_000001a8,in_stack_000001a0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pVVar1;
  if (pVVar1 != (Value *)0x0) {
    local_4d = 0;
    toml::Value::as<std::__cxx11::string>
              ((Value *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    SamplePublisher::create(in_stack_ffffffffffffff38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"send_buffer",&local_79);
    pVVar1 = toml::Value::find(in_stack_000001a8,in_stack_000001a0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (pVVar1 != (Value *)0x0) {
      local_58 = pVVar1;
      std::unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>::operator->
                ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)0x17c61a);
      toml::Value::as<int>((Value *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      Publisher::setSendBuffer(in_stack_00000110,in_stack_0000010c);
    }
    return (__uniq_ptr_data<SamplePublisher,_std::default_delete<SamplePublisher>,_true,_true>)
           (tuple<SamplePublisher_*,_std::default_delete<SamplePublisher>_>)
           in_RDI.super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t
           .super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected publisher section to have \"bind\" key");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::unique_ptr<SamplePublisher> createSamplePublisher(const toml::Value& v) {
  auto bind = v.find("bind");
  if (!bind) {
    throw std::invalid_argument(
        "Expected publisher section to have \"bind\" key");
  }

  // Only need bind value to create publisher
  auto p = SamplePublisher::create(bind->as<std::string>());

  // Optional send buffer size
  auto sendBuffer = v.find("send_buffer");
  if (sendBuffer) {
    p->setSendBuffer(sendBuffer->as<int>());
  }

  return p;
}